

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.cpp
# Opt level: O1

int EigenRealGeneral(int n,double **a,double *v,double *vi,double **u,int *iwork,double *work)

{
  undefined1 (*pauVar1) [64];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double *pdVar15;
  double *pdVar16;
  double *pdVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  ulong uVar22;
  double dVar23;
  undefined8 uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  uint uVar34;
  uint uVar35;
  long lVar36;
  uint uVar37;
  ulong uVar38;
  int iVar39;
  int iVar40;
  uint uVar41;
  long lVar42;
  ulong uVar43;
  long lVar44;
  ulong uVar45;
  ulong uVar46;
  int iVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  uint uVar51;
  long lVar52;
  ulong uVar53;
  long lVar54;
  double **ppdVar55;
  ulong uVar56;
  ulong uVar57;
  uint uVar58;
  long lVar59;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  double **ppdVar63;
  bool bVar64;
  bool bVar65;
  bool bVar66;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  double dVar67;
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  double dVar68;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar102 [64];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 in_ZMM1 [64];
  double dVar119;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 in_ZMM7 [64];
  undefined1 auVar156 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 in_ZMM11 [64];
  double dVar159;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 in_ZMM12 [64];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 in_ZMM28 [64];
  uint local_15c;
  int local_13c;
  double local_138;
  undefined1 local_d8 [64];
  double local_98;
  undefined1 extraout_var [56];
  
  uVar34 = n - 1;
  uVar60 = uVar34;
  if (0 < n) {
    in_ZMM1 = ZEXT864(0) << 0x40;
    uVar43 = (ulong)uVar34;
    uVar58 = uVar34;
    do {
      if (-1 < (int)uVar58) {
        uVar38 = 0;
        do {
          if (uVar43 != uVar38) {
            dVar67 = a[uVar43][uVar38];
            in_ZMM0 = ZEXT864((ulong)dVar67);
            uVar60 = uVar58;
            if ((dVar67 != 0.0) || (NAN(dVar67))) goto LAB_0010bd16;
          }
          uVar38 = uVar38 + 1;
        } while (uVar58 + 1 != uVar38);
      }
      uVar62 = 0;
      Exchange((int)uVar43,0,uVar58,uVar58,n,a,work);
      auVar69 = in_ZMM28._0_16_;
      in_ZMM1 = ZEXT864(0) << 0x40;
      uVar60 = uVar58 - 1;
      if ((int)uVar58 < 1) goto LAB_0010bfe1;
LAB_0010bd16:
      bVar64 = 0 < (long)uVar43;
      uVar43 = uVar43 - 1;
      uVar58 = uVar60;
    } while (bVar64);
  }
  auVar69 = in_ZMM28._0_16_;
  if ((int)uVar60 < 0) {
    uVar62 = 0;
  }
  else {
    uVar43 = 0;
    in_ZMM1 = ZEXT864(0) << 0x40;
    uVar62 = 0;
    do {
      if ((int)uVar62 <= (int)uVar60) {
        lVar48 = 0;
        do {
          if (uVar43 - (long)(int)uVar62 != lVar48) {
            dVar67 = a[(int)uVar62 + lVar48][uVar43];
            in_ZMM0 = ZEXT864((ulong)dVar67);
            if ((dVar67 != 0.0) || (NAN(dVar67))) goto LAB_0010bd96;
          }
          lVar48 = lVar48 + 1;
        } while ((uVar60 + 1) - uVar62 != (int)lVar48);
      }
      Exchange((int)uVar43,uVar62,uVar60,uVar62,n,a,work);
      in_ZMM1 = ZEXT864(0) << 0x40;
      uVar62 = uVar62 + 1;
LAB_0010bd96:
      auVar69 = in_ZMM28._0_16_;
      uVar43 = uVar43 + 1;
    } while (uVar43 != uVar60 + 1);
  }
  lVar48 = (long)(int)uVar62;
  if ((int)uVar62 <= (int)uVar60) {
    in_ZMM0 = vpbroadcastq_avx512f();
    uVar43 = 0;
    in_ZMM1 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar86 = vbroadcastsd_avx512f(ZEXT816(0x3ff0000000000000));
    do {
      auVar87 = vpbroadcastq_avx512f();
      auVar87 = vporq_avx512f(auVar87,in_ZMM1);
      uVar38 = vpcmpuq_avx512f(auVar87,in_ZMM0,2);
      auVar87 = *(undefined1 (*) [64])(work + lVar48 + uVar43);
      bVar64 = (bool)((byte)uVar38 & 1);
      auVar88._0_8_ = (ulong)bVar64 * auVar86._0_8_ | (ulong)!bVar64 * auVar87._0_8_;
      bVar64 = (bool)((byte)(uVar38 >> 1) & 1);
      auVar88._8_8_ = (ulong)bVar64 * auVar86._8_8_ | (ulong)!bVar64 * auVar87._8_8_;
      bVar64 = (bool)((byte)(uVar38 >> 2) & 1);
      auVar88._16_8_ = (ulong)bVar64 * auVar86._16_8_ | (ulong)!bVar64 * auVar87._16_8_;
      bVar64 = (bool)((byte)(uVar38 >> 3) & 1);
      auVar88._24_8_ = (ulong)bVar64 * auVar86._24_8_ | (ulong)!bVar64 * auVar87._24_8_;
      bVar64 = (bool)((byte)(uVar38 >> 4) & 1);
      auVar88._32_8_ = (ulong)bVar64 * auVar86._32_8_ | (ulong)!bVar64 * auVar87._32_8_;
      bVar64 = (bool)((byte)(uVar38 >> 5) & 1);
      auVar88._40_8_ = (ulong)bVar64 * auVar86._40_8_ | (ulong)!bVar64 * auVar87._40_8_;
      bVar64 = (bool)((byte)(uVar38 >> 6) & 1);
      auVar88._48_8_ = (ulong)bVar64 * auVar86._48_8_ | (ulong)!bVar64 * auVar87._48_8_;
      auVar88._56_8_ =
           (uVar38 >> 7) * auVar86._56_8_ | (ulong)!SUB81(uVar38 >> 7,0) * auVar87._56_8_;
      *(undefined1 (*) [64])(work + lVar48 + uVar43) = auVar88;
      uVar43 = uVar43 + 8;
    } while (((ulong)(uVar60 - uVar62) + 8 & 0xfffffffffffffff8) != uVar43);
  }
  if ((int)uVar62 <= (int)uVar60) {
    in_ZMM0 = vpbroadcastq_avx512f();
    in_ZMM1 = ZEXT864(0) << 0x40;
    auVar86 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    in_ZMM7 = ZEXT1664(ZEXT816(0x3fd0000000000000));
    auVar84._8_8_ = 0x7fffffffffffffff;
    auVar84._0_8_ = 0x7fffffffffffffff;
    lVar54 = lVar48;
    bVar64 = false;
    do {
      bVar66 = bVar64;
      auVar87 = ZEXT864(0) << 0x40;
      lVar44 = lVar48;
      uVar58 = uVar62 - 1;
      do {
        if (lVar54 != lVar44) {
          auVar70._8_8_ = 0;
          auVar70._0_8_ = a[lVar54][lVar44];
          auVar70 = vmovhpd_avx(auVar70,a[lVar44][lVar54]);
          auVar70 = vandpd_avx(auVar70,auVar84);
          in_ZMM10 = ZEXT1664(auVar70);
          auVar87 = ZEXT1664(CONCAT88(auVar87._8_8_ + auVar70._8_8_,auVar87._0_8_ + auVar70._0_8_));
        }
        lVar44 = lVar44 + 1;
        uVar58 = uVar58 + 1;
      } while (uVar60 != uVar58);
      auVar70 = vshufpd_avx(auVar87._0_16_,auVar87._0_16_,1);
      in_ZMM11 = ZEXT1664(auVar70);
      dVar67 = auVar70._0_8_;
      if ((dVar67 != 0.0) || (NAN(dVar67))) {
        dVar68 = auVar87._0_8_;
        if ((dVar68 != 0.0) || (NAN(dVar68))) {
          if (dVar68 * 0.5 <= dVar67) {
            in_ZMM10 = ZEXT1664(ZEXT816(0x3ff0000000000000));
            in_ZMM12 = ZEXT1664(auVar70);
          }
          else {
            in_ZMM12 = ZEXT1664(auVar70);
            in_ZMM10 = ZEXT1664(ZEXT816(0x3ff0000000000000));
            do {
              in_ZMM10 = ZEXT864((ulong)(in_ZMM10._0_8_ + in_ZMM10._0_8_));
              dVar119 = in_ZMM12._0_8_ * 4.0;
              in_ZMM12 = ZEXT864((ulong)dVar119);
            } while (dVar119 < dVar68 * 0.5);
          }
          while( true ) {
            dVar159 = in_ZMM12._0_8_;
            dVar119 = in_ZMM10._0_8_;
            if (dVar159 < dVar68 + dVar68) break;
            in_ZMM10 = ZEXT864((ulong)(dVar119 * 0.5));
            in_ZMM12 = ZEXT864((ulong)(dVar159 * 0.25));
          }
          dVar67 = (dVar68 + dVar67) * 0.95;
          in_ZMM11 = ZEXT864((ulong)dVar67);
          if ((dVar68 + dVar159) / dVar119 < dVar67) {
            work[lVar54] = dVar119 * work[lVar54];
            if ((int)uVar62 < n) {
              auVar71._0_8_ = 1.0 / dVar119;
              auVar71._8_8_ = 0;
              auVar87 = vbroadcastsd_avx512f(auVar71);
              pdVar15 = a[lVar54];
              uVar43 = 0;
              do {
                auVar88 = vpbroadcastq_avx512f();
                auVar88 = vporq_avx512f(auVar88,auVar86);
                uVar38 = vpcmpuq_avx512f(auVar88,in_ZMM0,2);
                pdVar16 = pdVar15 + lVar48 + uVar43;
                auVar90._8_8_ = (ulong)((byte)(uVar38 >> 1) & 1) * (long)pdVar16[1];
                auVar90._0_8_ = (ulong)((byte)uVar38 & 1) * (long)*pdVar16;
                auVar90._16_8_ = (ulong)((byte)(uVar38 >> 2) & 1) * (long)pdVar16[2];
                auVar90._24_8_ = (ulong)((byte)(uVar38 >> 3) & 1) * (long)pdVar16[3];
                auVar90._32_8_ = (ulong)((byte)(uVar38 >> 4) & 1) * (long)pdVar16[4];
                auVar90._40_8_ = (ulong)((byte)(uVar38 >> 5) & 1) * (long)pdVar16[5];
                auVar90._48_8_ = (ulong)((byte)(uVar38 >> 6) & 1) * (long)pdVar16[6];
                auVar90._56_8_ = (uVar38 >> 7) * (long)pdVar16[7];
                in_ZMM11 = vmulpd_avx512f(auVar87,auVar90);
                pauVar1 = (undefined1 (*) [64])(pdVar15 + lVar48 + uVar43);
                auVar88 = *pauVar1;
                bVar64 = (bool)((byte)uVar38 & 1);
                auVar89._0_8_ = (ulong)bVar64 * in_ZMM11._0_8_ | (ulong)!bVar64 * auVar88._0_8_;
                bVar64 = (bool)((byte)(uVar38 >> 1) & 1);
                auVar89._8_8_ = (ulong)bVar64 * in_ZMM11._8_8_ | (ulong)!bVar64 * auVar88._8_8_;
                bVar64 = (bool)((byte)(uVar38 >> 2) & 1);
                auVar89._16_8_ = (ulong)bVar64 * in_ZMM11._16_8_ | (ulong)!bVar64 * auVar88._16_8_;
                bVar64 = (bool)((byte)(uVar38 >> 3) & 1);
                auVar89._24_8_ = (ulong)bVar64 * in_ZMM11._24_8_ | (ulong)!bVar64 * auVar88._24_8_;
                bVar64 = (bool)((byte)(uVar38 >> 4) & 1);
                auVar89._32_8_ = (ulong)bVar64 * in_ZMM11._32_8_ | (ulong)!bVar64 * auVar88._32_8_;
                bVar64 = (bool)((byte)(uVar38 >> 5) & 1);
                auVar89._40_8_ = (ulong)bVar64 * in_ZMM11._40_8_ | (ulong)!bVar64 * auVar88._40_8_;
                bVar64 = (bool)((byte)(uVar38 >> 6) & 1);
                auVar89._48_8_ = (ulong)bVar64 * in_ZMM11._48_8_ | (ulong)!bVar64 * auVar88._48_8_;
                auVar89._56_8_ =
                     (uVar38 >> 7) * in_ZMM11._56_8_ | (ulong)!SUB81(uVar38 >> 7,0) * auVar88._56_8_
                ;
                *pauVar1 = auVar89;
                uVar43 = uVar43 + 8;
              } while (((n - lVar48) + 7U & 0xfffffffffffffff8) != uVar43);
            }
            bVar66 = true;
            if (-1 < (int)uVar60) {
              uVar43 = 0;
              do {
                a[uVar43][lVar54] = dVar119 * a[uVar43][lVar54];
                uVar43 = uVar43 + 1;
              } while (uVar60 + 1 != uVar43);
            }
          }
        }
      }
      lVar54 = lVar54 + 1;
      bVar64 = bVar66;
    } while ((uVar60 + 1 != (uint)lVar54) || (lVar54 = lVar48, bVar64 = false, bVar66));
  }
LAB_0010bfe1:
  auVar84 = in_ZMM7._0_16_;
  EigenRG(int,double**,double*,double*,double**,int*,double*)::is1 = uVar62;
  EigenRG(int,double**,double*,double*,double**,int*,double*)::is2 = uVar60;
  if ((int)(uVar62 + 1) < (int)uVar60) {
    uVar38 = (ulong)(int)uVar62;
    uVar43 = uVar38 + 1;
    lVar48 = (long)n;
    auVar72._8_8_ = 0x7fffffffffffffff;
    auVar72._0_8_ = 0x7fffffffffffffff;
    in_ZMM0 = ZEXT1664(auVar72);
    in_ZMM1 = ZEXT864(0) << 0x40;
    do {
      uVar45 = uVar43 & 0xffffffff;
      auVar86 = ZEXT864(0) << 0x40;
      uVar57 = uVar38;
      do {
        lVar54 = uVar57 + 1;
        auVar73._8_8_ = 0;
        auVar73._0_8_ = a[lVar54][uVar43 - 1];
        auVar70 = vandpd_avx(auVar73,auVar72);
        auVar71 = vandpd_avx(auVar86._0_16_,auVar72);
        uVar57 = uVar57 + 1;
        uVar24 = vcmpsd_avx512f(auVar71,auVar70,1);
        bVar64 = (bool)((byte)uVar24 & 1);
        dVar67 = (double)((ulong)bVar64 * (long)a[lVar54][uVar43 - 1] +
                         (ulong)!bVar64 * auVar86._0_8_);
        auVar86 = ZEXT1664(CONCAT88(auVar86._8_8_,dVar67));
        if (auVar71._0_8_ < auVar70._0_8_) {
          uVar45 = uVar57 & 0xffffffff;
        }
      } while ((long)uVar57 < (long)(int)uVar60);
      iVar47 = (int)uVar45;
      iwork[uVar43] = iVar47;
      if (iVar47 != (int)uVar43) {
        if ((long)uVar43 <= lVar48) {
          pdVar15 = a[iVar47];
          pdVar16 = a[uVar43];
          uVar57 = uVar38;
          do {
            dVar68 = pdVar15[uVar57];
            pdVar15[uVar57] = pdVar16[uVar57];
            pdVar16[uVar57] = dVar68;
            uVar57 = uVar57 + 1;
          } while ((long)uVar57 < lVar48);
        }
        if (-1 < (int)uVar60) {
          uVar57 = 0;
          do {
            pdVar15 = a[uVar57];
            dVar68 = pdVar15[iVar47];
            pdVar15[iVar47] = pdVar15[uVar43];
            pdVar15[uVar43] = dVar68;
            uVar57 = uVar57 + 1;
          } while (uVar60 + 1 != uVar57);
        }
      }
      uVar57 = uVar43;
      if ((dVar67 != 0.0) || (NAN(dVar67))) {
        do {
          pdVar15 = a[uVar57 + 1];
          uVar57 = uVar57 + 1;
          dVar68 = pdVar15[uVar43 - 1];
          if ((dVar68 != 0.0) || (NAN(dVar68))) {
            auVar74._0_8_ = dVar68 / dVar67;
            auVar74._8_8_ = 0;
            pdVar15[uVar43 - 1] = auVar74._0_8_;
            if ((long)uVar43 < lVar48) {
              pdVar16 = a[uVar43];
              auVar75._0_8_ = -auVar74._0_8_;
              auVar75._8_8_ = 0x8000000000000000;
              uVar45 = uVar43;
              do {
                auVar77._8_8_ = 0;
                auVar77._0_8_ = pdVar16[uVar45];
                auVar76._8_8_ = 0;
                auVar76._0_8_ = pdVar15[uVar45];
                auVar70 = vfmadd213sd_fma(auVar77,auVar75,auVar76);
                pdVar15[uVar45] = auVar70._0_8_;
                uVar45 = uVar45 + 1;
              } while ((long)uVar45 < lVar48);
            }
            if (-1 < (int)uVar60) {
              uVar45 = 0;
              do {
                pdVar15 = a[uVar45];
                auVar79._8_8_ = 0;
                auVar79._0_8_ = pdVar15[uVar57];
                auVar78._8_8_ = 0;
                auVar78._0_8_ = pdVar15[uVar43];
                auVar70 = vfmadd213sd_fma(auVar79,auVar74,auVar78);
                pdVar15[uVar43] = auVar70._0_8_;
                uVar45 = uVar45 + 1;
              } while (uVar60 + 1 != uVar45);
            }
          }
        } while ((long)uVar57 < (long)(int)uVar60);
      }
      uVar43 = uVar43 + 1;
      uVar38 = uVar38 + 1;
    } while (uVar60 != (uint)uVar43);
  }
  uVar58 = EigenRG(int,double**,double*,double*,double**,int*,double*)::is2;
  uVar60 = EigenRG(int,double**,double*,double*,double**,int*,double*)::is1;
  lVar48 = (long)(int)EigenRG(int,double**,double*,double*,double**,int*,double*)::is1;
  if (0 < n) {
    in_ZMM0 = vpbroadcastq_avx512f();
    uVar43 = 0;
    in_ZMM1 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar86 = vpbroadcastq_avx512f();
      auVar86 = vpsllq_avx512f(auVar86,3);
      uVar38 = 0;
      do {
        auVar87 = vpbroadcastq_avx512f();
        auVar87 = vporq_avx512f(auVar87,in_ZMM1);
        uVar57 = vpcmpuq_avx512f(auVar87,in_ZMM0,2);
        auVar88 = vmovdqu64_avx512f(*(undefined1 (*) [64])(u + uVar38));
        auVar87._8_8_ = (ulong)((byte)(uVar57 >> 1) & 1) * auVar88._8_8_;
        auVar87._0_8_ = (ulong)((byte)uVar57 & 1) * auVar88._0_8_;
        auVar87._16_8_ = (ulong)((byte)(uVar57 >> 2) & 1) * auVar88._16_8_;
        auVar87._24_8_ = (ulong)((byte)(uVar57 >> 3) & 1) * auVar88._24_8_;
        auVar87._32_8_ = (ulong)((byte)(uVar57 >> 4) & 1) * auVar88._32_8_;
        auVar87._40_8_ = (ulong)((byte)(uVar57 >> 5) & 1) * auVar88._40_8_;
        auVar87._48_8_ = (ulong)((byte)(uVar57 >> 6) & 1) * auVar88._48_8_;
        auVar87._56_8_ = (uVar57 >> 7) * auVar88._56_8_;
        auVar87 = vpaddq_avx512f(auVar87,auVar86);
        vscatterqpd_avx512f(ZEXT864(0) + auVar87,uVar57,ZEXT864(0) << 0x40);
        uVar38 = uVar38 + 8;
      } while ((n + 7U & 0xfffffff8) != uVar38);
      u[uVar43][uVar43] = 1.0;
      uVar43 = uVar43 + 1;
    } while (uVar43 != (uint)n);
  }
  auVar70 = in_ZMM1._0_16_;
  lVar54 = (long)(int)uVar58;
  if ((int)(lVar48 + 1) < (int)uVar58) {
    lVar52 = 0;
    lVar44 = lVar54;
    do {
      lVar49 = lVar44 + -1;
      lVar59 = lVar52;
      if (lVar44 <= lVar54) {
        do {
          in_ZMM0 = ZEXT864((ulong)a[lVar54 + lVar59][lVar44 + -2]);
          u[lVar54 + lVar59][lVar49] = a[lVar54 + lVar59][lVar44 + -2];
          lVar59 = lVar59 + 1;
        } while ((int)lVar59 != 1);
      }
      iVar47 = iwork[lVar49];
      if (iVar47 != (int)lVar49) {
        if (lVar49 <= lVar54) {
          pdVar15 = u[lVar49];
          pdVar16 = u[iVar47];
          lVar44 = lVar52;
          do {
            dVar67 = pdVar16[lVar54 + lVar44 + -1];
            in_ZMM0 = ZEXT864((ulong)dVar67);
            pdVar15[lVar54 + lVar44 + -1] = dVar67;
            pdVar16[lVar54 + lVar44 + -1] = 0.0;
            lVar44 = lVar44 + 1;
          } while ((int)lVar44 != 2);
        }
        u[iVar47][lVar49] = 1.0;
      }
      lVar52 = lVar52 + -1;
      lVar44 = lVar49;
    } while (lVar48 + 1 < lVar49);
  }
  if (n < 1) {
    auVar69 = vxorpd_avx512vl(auVar69,auVar69);
    auVar86 = ZEXT1664(auVar69);
  }
  else {
    uVar43 = 0;
    auVar69 = vxorpd_avx512vl(auVar69,auVar69);
    auVar86 = ZEXT1664(auVar69);
    auVar69._8_8_ = 0x7fffffffffffffff;
    auVar69._0_8_ = 0x7fffffffffffffff;
    in_ZMM0 = ZEXT1664(auVar69);
    uVar38 = 0;
    do {
      if ((int)uVar38 < n) {
        do {
          auVar80._8_8_ = 0;
          auVar80._0_8_ = a[uVar43][uVar38];
          auVar70 = vandpd_avx(auVar80,auVar69);
          in_ZMM1 = ZEXT1664(auVar70);
          auVar70 = vaddsd_avx512f(auVar86._0_16_,auVar70);
          auVar86 = ZEXT1664(auVar70);
          uVar38 = uVar38 + 1;
        } while ((uint)n != uVar38);
      }
      if ((long)uVar43 < lVar48 || lVar54 < (long)uVar43) {
        in_ZMM1 = ZEXT864((ulong)a[uVar43][uVar43]);
        v[uVar43] = a[uVar43][uVar43];
        vi[uVar43] = 0.0;
      }
      auVar70 = in_ZMM1._0_16_;
      uVar38 = uVar43 & 0xffffffff;
      uVar43 = uVar43 + 1;
    } while (uVar43 != (uint)n);
  }
  if ((int)uVar60 <= (int)uVar58) {
    local_13c = n * 0x1e;
    lVar44 = (long)n;
    iVar47 = (uVar58 - uVar60) + 1;
    auVar87 = ZEXT864(0) << 0x40;
    auVar81._8_8_ = 0x7fffffffffffffff;
    auVar81._0_8_ = 0x7fffffffffffffff;
    local_138 = 0.0;
    auVar69 = auVar86._0_16_;
    uVar62 = uVar58;
LAB_0010cbd9:
    uVar43 = (ulong)uVar62;
    uVar37 = uVar62 - 1;
    local_15c = uVar62 - 2;
    lVar59 = (long)(int)uVar62;
    lVar49 = (long)(int)uVar37;
    lVar52 = (long)(int)local_15c;
    uVar51 = uVar60;
    if ((int)uVar60 < (int)uVar62) {
      uVar51 = uVar62;
    }
    iVar39 = uVar51 + (1 - uVar60);
    auVar82._12_4_ = 0;
    auVar82._0_12_ = local_d8._4_12_;
    local_d8._0_16_ = auVar82 << 0x20;
    do {
      auVar83 = in_ZMM0._0_16_;
      lVar36 = lVar59;
      uVar51 = uVar62;
      if ((int)uVar60 < (int)uVar62) {
        do {
          auVar104._8_8_ = 0;
          auVar104._0_8_ = a[lVar36 + -1][lVar36 + -1];
          auVar84 = vandpd_avx(auVar81,auVar104);
          auVar121._8_8_ = 0;
          auVar121._0_8_ = a[lVar36][lVar36 + -1];
          auVar130._8_8_ = 0;
          auVar130._0_8_ = a[lVar36][lVar36];
          auVar70 = vandpd_avx(auVar81,auVar130);
          dVar67 = auVar84._0_8_ + auVar70._0_8_;
          auVar155._8_8_ = 0;
          auVar155._0_8_ = dVar67;
          uVar24 = vcmpsd_avx512f(auVar155,auVar87._0_16_,0);
          bVar64 = (bool)((byte)uVar24 & 1);
          dVar68 = (double)((ulong)bVar64 * auVar86._0_8_ + (ulong)!bVar64 * (long)dVar67);
          in_ZMM7 = ZEXT864((ulong)dVar68);
          auVar84 = vandpd_avx(auVar81,auVar121);
          dVar67 = auVar84._0_8_ + dVar68;
          if ((dVar67 == dVar68) && (!NAN(dVar67) && !NAN(dVar68))) {
            uVar51 = (uint)lVar36;
            break;
          }
          lVar36 = lVar36 + -1;
          uVar51 = uVar60;
        } while (lVar48 < lVar36);
      }
      pdVar15 = a[lVar59];
      dVar67 = pdVar15[lVar59];
      if (uVar51 == uVar62) goto LAB_0010d317;
      pdVar16 = a[lVar49];
      auVar156._8_8_ = 0;
      auVar156._0_8_ = pdVar16[lVar49];
      in_ZMM10 = ZEXT1664(auVar156);
      local_98 = pdVar15[lVar49] * pdVar16[lVar59];
      if (uVar51 == uVar37) goto LAB_0010d317;
      bVar64 = local_13c == 0;
      local_13c = local_13c + -1;
      if (bVar64) goto LAB_0010d6ba;
      lVar36 = lVar48;
      iVar40 = iVar39;
      if ((local_d8._0_4_ == 0x14) || (local_d8._0_4_ == 10)) {
        do {
          a[lVar36][lVar36] = a[lVar36][lVar36] - dVar67;
          iVar40 = iVar40 + -1;
          lVar36 = lVar36 + 1;
        } while (iVar40 != 0);
        local_138 = dVar67 + local_138;
        auVar105._8_8_ = 0;
        auVar105._0_8_ = pdVar15[lVar49];
        auVar84 = vandpd_avx(auVar81,auVar105);
        auVar122._8_8_ = 0;
        auVar122._0_8_ = pdVar16[lVar52];
        auVar70 = vandpd_avx(auVar81,auVar122);
        dVar68 = auVar84._0_8_ + auVar70._0_8_;
        in_ZMM7 = ZEXT864((ulong)dVar68);
        dVar67 = dVar68 * 0.75;
        local_98 = dVar68 * dVar68 * -0.4375;
        auVar156._8_8_ = 0;
        auVar156._0_8_ = dVar67;
      }
      auVar88 = ZEXT864((ulong)dVar67);
      uVar61 = local_15c;
      if ((int)uVar51 <= (int)local_15c) {
        auVar33._8_8_ = 0;
        auVar33._0_8_ = local_98;
        auVar25._8_8_ = 0x8000000000000000;
        auVar25._0_8_ = 0x8000000000000000;
        auVar84 = vxorpd_avx512vl(auVar33,auVar25);
        lVar36 = 0;
        do {
          pdVar15 = a[lVar52 + lVar36];
          dVar68 = pdVar15[lVar52 + lVar36];
          auVar83._8_8_ = 0;
          auVar83._0_8_ = dVar68;
          dVar23 = auVar156._0_8_ - dVar68;
          dVar119 = a[lVar52 + lVar36 + 1][lVar52 + lVar36 + 1];
          auVar123._8_8_ = 0;
          auVar123._0_8_ = dVar119;
          auVar131._8_8_ = 0;
          auVar131._0_8_ = dVar67 - dVar68;
          auVar142._8_8_ = 0;
          auVar142._0_8_ = dVar23;
          auVar70 = vfmadd213sd_fma(auVar142,auVar131,auVar84);
          dVar159 = auVar70._0_8_ / a[lVar52 + lVar36 + 1][lVar52 + lVar36] +
                    pdVar15[lVar52 + lVar36 + 1];
          auVar132._8_8_ = 0;
          auVar132._0_8_ = dVar159;
          auVar70 = vandpd_avx(auVar81,auVar132);
          auVar150._8_8_ = 0;
          auVar150._0_8_ = ((dVar119 - dVar68) - (dVar67 - dVar68)) - dVar23;
          auVar71 = vandpd_avx(auVar81,auVar150);
          auVar153._8_8_ = 0;
          auVar153._0_8_ = a[lVar52 + lVar36 + 2][lVar52 + lVar36 + 1];
          auVar72 = vandpd_avx(auVar81,auVar153);
          dVar68 = auVar72._0_8_ + auVar70._0_8_ + auVar71._0_8_;
          in_ZMM7 = ZEXT864((ulong)dVar68);
          auVar161._0_8_ = dVar159 / dVar68;
          auVar161._8_8_ = 0;
          in_ZMM12 = ZEXT1664(auVar161);
          auVar70 = vunpcklpd_avx(auVar150,auVar153);
          auVar143._8_8_ = dVar68;
          auVar143._0_8_ = dVar68;
          auVar70 = vdivpd_avx(auVar70,auVar143);
          in_ZMM11 = ZEXT1664(auVar70);
          uVar61 = uVar51;
          if ((int)uVar51 - lVar52 == lVar36) goto LAB_0010cedb;
          auVar154._8_8_ = 0x7fffffffffffffff;
          auVar154._0_8_ = 0x7fffffffffffffff;
          auVar71 = vandpd_avx(auVar161,auVar154);
          auVar144._8_8_ = 0;
          auVar144._0_8_ = a[lVar52 + lVar36 + -1][lVar52 + lVar36 + -1];
          auVar72 = vandpd_avx(auVar144,auVar154);
          auVar73 = vandpd_avx(auVar83,auVar154);
          auVar74 = vandpd_avx(auVar123,auVar154);
          dVar68 = auVar71._0_8_ * (auVar74._0_8_ + auVar73._0_8_ + auVar72._0_8_);
          auVar70 = vandpd_avx(auVar70,auVar154);
          auVar133._0_8_ = auVar70._0_8_ + auVar70._8_8_;
          auVar133._8_8_ = auVar70._0_8_ + auVar70._8_8_;
          auVar145._8_8_ = 0;
          auVar145._0_8_ = pdVar15[lVar52 + lVar36 + -1];
          auVar70 = vandpd_avx(auVar145,auVar154);
          auVar124._8_8_ = 0;
          auVar124._0_8_ = dVar68;
          auVar70 = vfmadd213sd_fma(auVar133,auVar70,auVar124);
          lVar36 = lVar36 + -1;
        } while ((auVar70._0_8_ != dVar68) || (NAN(auVar70._0_8_) || NAN(dVar68)));
        uVar61 = (int)lVar36 + uVar37;
      }
LAB_0010cedb:
      lVar36 = (long)(int)uVar61;
      if ((int)(uVar61 + 2) <= (int)uVar62) {
        lVar50 = 0;
        do {
          pdVar15 = a[lVar36 + lVar50 + 2];
          pdVar15[lVar36 + lVar50] = 0.0;
          if (lVar50 != 0) {
            pdVar15[lVar36 + lVar50 + -1] = 0.0;
          }
          lVar50 = lVar50 + 1;
        } while (uVar37 - uVar61 != (int)lVar50);
      }
      auVar84 = vunpcklpd_avx(auVar156,auVar83);
      in_ZMM10 = ZEXT1664(auVar84);
      if ((int)uVar61 < (int)uVar62) {
        uVar41 = uVar61 + 3;
        lVar50 = lVar36;
        do {
          dVar67 = auVar88._0_8_;
          auVar162 = in_ZMM12._0_16_;
          auVar84 = in_ZMM11._0_16_;
          uVar38 = (ulong)uVar41;
          if ((int)uVar62 < (int)uVar41) {
            uVar38 = uVar43;
          }
          if (lVar50 == lVar36) {
LAB_0010cfd3:
            auVar107._8_8_ = 0;
            auVar107._0_8_ = auVar84._0_8_ * auVar84._0_8_;
            auVar71 = vfmadd231sd_fma(auVar107,auVar162,auVar162);
            auVar70 = vshufpd_avx(auVar84,auVar84,1);
            auVar70 = vfmadd213sd_fma(auVar70,auVar70,auVar71);
            if (auVar70._0_8_ < 0.0) {
              auVar102._0_8_ = sqrt(auVar70._0_8_);
              auVar102._8_56_ = extraout_var;
              auVar70 = auVar102._0_16_;
              auVar87 = ZEXT864(0) << 0x40;
              auVar86 = ZEXT1664(auVar69);
            }
            else {
              auVar70 = vsqrtsd_avx(auVar70,auVar70);
            }
            auVar125._0_8_ = auVar70._0_8_ ^ 0x8000000000000000;
            auVar125._8_8_ = auVar70._8_8_ ^ 0x8000000000000000;
            uVar24 = vcmpsd_avx512f(auVar125,auVar70,2);
            bVar64 = (bool)((byte)uVar24 & 1);
            uVar57 = (ulong)bVar64 * auVar70._0_8_ + !bVar64 * auVar125._0_8_;
            uVar24 = vcmpsd_avx512f(auVar87._0_16_,auVar162,2);
            bVar64 = (bool)((byte)uVar24 & 1);
            auVar85._0_8_ =
                 (double)(bVar64 * uVar57 + (ulong)!bVar64 * (uVar57 ^ 0x8000000000000000));
            auVar85._8_8_ = auVar70._8_8_;
            in_ZMM7 = ZEXT1664(auVar85);
            if (lVar50 == lVar36) {
              if (uVar51 != uVar61) {
                auVar94._8_8_ = 0;
                auVar94._0_8_ = a[lVar50][lVar50 + -1];
                auVar26._8_8_ = 0x8000000000000000;
                auVar26._0_8_ = 0x8000000000000000;
                auVar70 = vxorpd_avx512vl(auVar94,auVar26);
                dVar67 = (double)vmovlpd_avx(auVar70);
                a[lVar50][lVar50 + -1] = dVar67;
              }
            }
            else {
              auVar27._8_8_ = 0x8000000000000000;
              auVar27._0_8_ = 0x8000000000000000;
              auVar70 = vxorpd_avx512vl(auVar85,auVar27);
              a[lVar50][lVar50 + -1] = dVar67 * auVar70._0_8_;
            }
            dVar67 = auVar162._0_8_ + auVar85._0_8_;
            auVar176._0_8_ = dVar67 / auVar85._0_8_;
            auVar176._8_8_ = 0;
            auVar88 = ZEXT1664(auVar176);
            auVar108._8_8_ = auVar85._0_8_;
            auVar108._0_8_ = auVar85._0_8_;
            auVar70 = vdivpd_avx(auVar84,auVar108);
            in_ZMM10 = ZEXT1664(auVar70);
            auVar95._8_8_ = dVar67;
            auVar95._0_8_ = dVar67;
            auVar84 = vdivpd_avx(auVar84,auVar95);
            in_ZMM11 = ZEXT1664(auVar84);
            dVar67 = auVar70._0_8_;
            if (lVar50 == lVar49) {
              if (lVar50 < lVar44) {
                pdVar15 = a[lVar50];
                pdVar16 = a[lVar50 + 1];
                lVar42 = lVar50;
                do {
                  auVar96._8_8_ = 0;
                  auVar96._0_8_ = pdVar15[lVar42];
                  auVar109._8_8_ = 0;
                  auVar109._0_8_ = pdVar16[lVar42];
                  auVar71 = vfmadd213sd_fma(auVar109,auVar84,auVar96);
                  auVar72 = vfnmadd231sd_fma(auVar96,auVar71,auVar176);
                  pdVar15[lVar42] = auVar72._0_8_;
                  auVar7._8_8_ = 0;
                  auVar7._0_8_ = pdVar16[lVar42];
                  auVar71 = vfnmadd213sd_fma(auVar71,auVar70,auVar7);
                  pdVar16[lVar42] = auVar71._0_8_;
                  lVar42 = lVar42 + 1;
                } while (lVar42 < lVar44);
              }
              uVar35 = (int)lVar50 + 3;
              if ((int)uVar62 < (int)uVar35) {
                uVar35 = uVar62;
              }
              if (-1 < (int)uVar35) {
                lVar42 = 0;
                do {
                  pdVar15 = a[lVar42];
                  auVar97._8_8_ = 0;
                  auVar97._0_8_ = pdVar15[lVar50];
                  auVar110._8_8_ = 0;
                  auVar110._0_8_ = pdVar15[lVar50 + 1];
                  auVar126._8_8_ = 0;
                  auVar126._0_8_ = dVar67 * pdVar15[lVar50 + 1];
                  auVar70 = vfmadd231sd_fma(auVar126,auVar176,auVar97);
                  pdVar15[lVar50] = pdVar15[lVar50] - auVar70._0_8_;
                  auVar70 = vfnmadd213sd_fma(auVar70,auVar84,auVar110);
                  pdVar15[lVar50 + 1] = auVar70._0_8_;
                  lVar42 = lVar42 + 1;
                } while (uVar38 + 1 != lVar42);
              }
              lVar42 = 0;
              do {
                pdVar15 = u[lVar48 + lVar42];
                auVar98._8_8_ = 0;
                auVar98._0_8_ = pdVar15[lVar50];
                auVar111._8_8_ = 0;
                auVar111._0_8_ = pdVar15[lVar50 + 1];
                auVar164._8_8_ = 0;
                auVar164._0_8_ = dVar67 * pdVar15[lVar50 + 1];
                auVar70 = vfmadd231sd_fma(auVar164,auVar176,auVar98);
                in_ZMM12 = ZEXT1664(auVar70);
                pdVar15[lVar50] = pdVar15[lVar50] - auVar70._0_8_;
                auVar70 = vfnmadd231sd_fma(auVar111,auVar70,auVar84);
                pdVar15[lVar50 + 1] = auVar70._0_8_;
                lVar42 = lVar42 + 1;
              } while (iVar47 != (int)lVar42);
            }
            else {
              auVar71 = vshufpd_avx(auVar70,auVar70,1);
              if (lVar50 < lVar44) {
                pdVar15 = a[lVar50];
                pdVar16 = a[lVar50 + 1];
                pdVar17 = a[lVar50 + 2];
                auVar72 = vshufpd_avx(auVar84,auVar84,1);
                lVar42 = lVar50;
                do {
                  auVar127._8_8_ = 0;
                  auVar127._0_8_ = pdVar15[lVar42];
                  auVar134._8_8_ = 0;
                  auVar134._0_8_ = pdVar16[lVar42];
                  auVar73 = vfmadd213sd_fma(auVar134,auVar84,auVar127);
                  auVar8._8_8_ = 0;
                  auVar8._0_8_ = pdVar17[lVar42];
                  auVar73 = vfmadd231sd_fma(auVar73,auVar72,auVar8);
                  auVar74 = vfnmadd231sd_fma(auVar127,auVar73,auVar176);
                  pdVar15[lVar42] = auVar74._0_8_;
                  auVar128._8_8_ = 0;
                  auVar128._0_8_ = pdVar16[lVar42];
                  auVar74 = vfnmadd231sd_fma(auVar128,auVar73,auVar70);
                  pdVar16[lVar42] = auVar74._0_8_;
                  auVar9._8_8_ = 0;
                  auVar9._0_8_ = pdVar17[lVar42];
                  auVar73 = vfnmadd213sd_fma(auVar73,auVar71,auVar9);
                  pdVar17[lVar42] = auVar73._0_8_;
                  lVar42 = lVar42 + 1;
                } while (lVar42 < lVar44);
              }
              uVar35 = (int)lVar50 + 3;
              if ((int)uVar62 < (int)uVar35) {
                uVar35 = uVar62;
              }
              if (-1 < (int)uVar35) {
                lVar42 = 0;
                do {
                  pdVar15 = a[lVar42];
                  auVar112._8_8_ = 0;
                  auVar112._0_8_ = pdVar15[lVar50];
                  auVar135._8_8_ = 0;
                  auVar135._0_8_ = dVar67 * SUB168(*(undefined1 (*) [16])(pdVar15 + lVar50 + 1),0);
                  auVar70 = vfmadd231sd_fma(auVar135,auVar176,auVar112);
                  auVar10._8_8_ = 0;
                  auVar10._0_8_ = pdVar15[lVar50 + 2];
                  auVar70 = vfmadd231sd_fma(auVar70,auVar71,auVar10);
                  dVar68 = auVar70._0_8_;
                  pdVar15[lVar50] = pdVar15[lVar50] - dVar68;
                  auVar113._8_8_ = dVar68;
                  auVar113._0_8_ = dVar68;
                  auVar70 = vfnmadd213pd_fma(auVar113,auVar84,
                                             *(undefined1 (*) [16])(pdVar15 + lVar50 + 1));
                  *(undefined1 (*) [16])(pdVar15 + lVar50 + 1) = auVar70;
                  lVar42 = lVar42 + 1;
                } while (uVar38 + 1 != lVar42);
              }
              lVar42 = 0;
              do {
                pdVar15 = u[lVar48 + lVar42];
                auVar114._8_8_ = 0;
                auVar114._0_8_ = pdVar15[lVar50];
                auVar165._8_8_ = 0;
                auVar165._0_8_ = dVar67 * SUB168(*(undefined1 (*) [16])(pdVar15 + lVar50 + 1),0);
                auVar70 = vfmadd231sd_fma(auVar165,auVar176,auVar114);
                auVar11._8_8_ = 0;
                auVar11._0_8_ = pdVar15[lVar50 + 2];
                auVar70 = vfmadd231sd_fma(auVar70,auVar71,auVar11);
                in_ZMM12 = ZEXT1664(auVar70);
                dVar68 = auVar70._0_8_;
                pdVar15[lVar50] = pdVar15[lVar50] - dVar68;
                auVar115._8_8_ = dVar68;
                auVar115._0_8_ = dVar68;
                auVar70 = vfnmadd213pd_fma(auVar115,auVar84,
                                           *(undefined1 (*) [16])(pdVar15 + lVar50 + 1));
                *(undefined1 (*) [16])(pdVar15 + lVar50 + 1) = auVar70;
                lVar42 = lVar42 + 1;
              } while (iVar47 != (int)lVar42);
            }
          }
          else {
            auVar92 = ZEXT816(0) << 0x40;
            if (lVar50 != lVar49) {
              auVar92._8_8_ = 0;
              auVar92._0_8_ = a[lVar50 + 2][lVar50 + -1];
            }
            auVar163._8_8_ = 0;
            auVar163._0_8_ = a[lVar50][lVar50 + -1];
            in_ZMM12 = ZEXT1664(auVar163);
            auVar106._8_8_ = 0;
            auVar106._0_8_ = a[lVar50 + 1][lVar50 + -1];
            auVar84 = vandpd_avx(auVar163,auVar81);
            auVar70 = vandpd_avx(auVar81,auVar106);
            auVar71 = vandpd_avx(auVar81,auVar92);
            dVar67 = auVar84._0_8_ + auVar70._0_8_ + auVar71._0_8_;
            auVar88 = ZEXT864((ulong)dVar67);
            auVar84 = vunpcklpd_avx(auVar106,auVar92);
            in_ZMM11 = ZEXT1664(auVar84);
            if ((dVar67 != 0.0) || (NAN(dVar67))) {
              auVar162._0_8_ = a[lVar50][lVar50 + -1] / dVar67;
              auVar162._8_8_ = 0;
              auVar93._8_8_ = dVar67;
              auVar93._0_8_ = dVar67;
              auVar84 = vdivpd_avx(auVar84,auVar93);
              goto LAB_0010cfd3;
            }
          }
          lVar50 = lVar50 + 1;
          uVar41 = uVar41 + 1;
        } while (lVar50 != lVar59);
      }
      local_d8._0_4_ = local_d8._0_4_ + 1;
      auVar84 = vshufpd_avx(in_ZMM10._0_16_,in_ZMM10._0_16_,1);
      in_ZMM0 = ZEXT1664(auVar84);
    } while( true );
  }
LAB_0010c36e:
  auVar69 = vucomisd_avx512f(ZEXT816(0) << 0x40);
  if (0 < n) {
    uVar62 = n - 2;
    uVar51 = n - 3;
    uVar43 = (ulong)(uint)n;
    auVar70 = vunpcklpd_avx(auVar70,auVar84);
    auVar120._8_8_ = 0x7fffffffffffffff;
    auVar120._0_8_ = 0x7fffffffffffffff;
    auVar129._8_8_ = 0x8000000000000000;
    auVar129._0_8_ = 0x8000000000000000;
    auVar84 = vmovhpd_avx(ZEXT816(0) << 0x40,0x3ff0000000000000);
    auVar152._8_8_ = 0x7fffffffffffffff;
    auVar152._0_8_ = 0x7fffffffffffffff;
    auVar86 = ZEXT864(0) << 0x40;
    uVar38 = uVar43 - 1;
    uVar57 = uVar43;
    do {
      uVar45 = (ulong)uVar62;
      auVar87 = ZEXT1664(auVar70);
      uVar46 = (ulong)uVar51;
      dVar67 = v[uVar38];
      auVar157._8_8_ = 0;
      auVar157._0_8_ = dVar67;
      dVar68 = vi[uVar38];
      auVar160._8_8_ = 0;
      auVar160._0_8_ = dVar68;
      uVar53 = uVar38 - 1;
      if (-1e-12 <= dVar68) {
        auVar71 = vshufpd_avx(auVar70,auVar70,1);
        auVar87 = ZEXT1664(auVar71);
        if (((dVar68 == auVar86._0_8_) && (!NAN(dVar68) && !NAN(auVar86._0_8_))) &&
           (a[uVar38][uVar38] = 1.0, 0 < (long)uVar38)) {
          lVar44 = uVar45 << 0x20;
          ppdVar63 = a + uVar45;
          uVar46 = uVar38 & 0xffffffff;
          do {
            pdVar15 = a[uVar45];
            uVar56 = (ulong)(int)uVar46;
            auVar86 = ZEXT864(0) << 0x40;
            auVar70 = auVar86._0_16_;
            bVar64 = uVar38 < uVar56;
            uVar22 = uVar38 - uVar56;
            bVar66 = uVar22 == 0;
            if ((long)uVar56 <= (long)uVar38) {
              do {
                auVar170._8_8_ = 0;
                auVar170._0_8_ = pdVar15[uVar56];
                auVar2._8_8_ = 0;
                auVar2._0_8_ = a[uVar56][uVar38];
                auVar70 = vfmadd231sd_fma(auVar86._0_16_,auVar170,auVar2);
                auVar86 = ZEXT1664(auVar70);
                uVar56 = uVar56 + 1;
                bVar64 = uVar57 < uVar56;
                uVar22 = uVar57 - uVar56;
                bVar66 = uVar22 == 0;
              } while (!bVar66);
            }
            dVar68 = pdVar15[uVar45] - dVar67;
            auVar183._8_8_ = 0;
            auVar183._0_8_ = vi[uVar45];
            auVar71 = vucomisd_avx512f(auVar183);
            auVar86 = ZEXT1664(auVar71);
            iVar47 = (int)uVar45;
            if (bVar64 || bVar66) {
              auVar72 = vucomisd_avx512f(auVar71);
              auVar171._8_8_ = 0;
              auVar171._0_8_ = dVar68;
              dVar119 = auVar71._0_8_;
              if ((bVar66) && ((POPCOUNT(uVar22 & 0xff) & 1U) != 0)) {
                dVar159 = dVar68;
                if ((dVar68 == dVar119) && (!NAN(dVar68) && !NAN(dVar119))) {
                  auVar88 = ZEXT1664(auVar69);
                  do {
                    dVar159 = auVar88._0_8_ * 0.01;
                    auVar88 = ZEXT864((ulong)dVar159);
                    auVar172._8_8_ = 0;
                    auVar172._0_8_ = dVar159;
                    vaddsd_avx512f(auVar69,auVar172);
                    vucomisd_avx512f(auVar69);
                  } while (dVar119 < dVar68);
                }
                pdVar15[uVar38] = -auVar70._0_8_ / dVar159;
              }
              else {
                auVar178._8_8_ = 0;
                auVar178._0_8_ = pdVar15[uVar45 + 1];
                pdVar16 = a[uVar45 + 1];
                auVar180._8_8_ = 0;
                auVar180._0_8_ = pdVar16[uVar45];
                auVar184._8_8_ = 0;
                auVar184._0_8_ = v[uVar45];
                auVar71 = vsubsd_avx512f(auVar184,auVar157);
                auVar72 = vmulsd_avx512f(auVar72,auVar72);
                auVar71 = vfmadd231sd_avx512f(auVar72,auVar71,auVar71);
                auVar73 = in_ZMM0._0_16_;
                auVar72 = vmulsd_avx512f(auVar70,auVar73);
                auVar72 = vfmsub231sd_avx512f(auVar72,auVar178,auVar87._0_16_);
                auVar71 = vdivsd_avx512f(auVar72,auVar71);
                vmovsd_avx512f(auVar71);
                pdVar15[uVar38] = pdVar15[uVar38];
                vandpd_avx512vl(auVar178,auVar120);
                auVar72 = vandpd_avx512vl(auVar73,auVar120);
                vucomisd_avx512f(auVar72);
                if (bVar64 || bVar66) {
                  auVar71 = vfnmsub213sd_avx512f(auVar71,auVar180,auVar87._0_16_);
                  auVar71 = vdivsd_avx512f(auVar71,auVar73);
                  dVar68 = auVar71._0_8_;
                }
                else {
                  auVar71 = vfnmsub213sd_avx512f(auVar71,auVar171,auVar70);
                  auVar71 = vdivsd_avx512f(auVar71,auVar178);
                  dVar68 = auVar71._0_8_;
                }
                pdVar16[uVar38] = dVar68;
              }
              dVar68 = pdVar15[uVar38];
              auVar173._8_8_ = 0;
              auVar173._0_8_ = dVar68;
              if ((dVar68 != dVar119) || (NAN(dVar68) || NAN(dVar119))) {
                if ((long)iVar47 <= (long)uVar38) {
                  auVar71 = vandpd_avx(auVar173,auVar152);
                  dVar68 = auVar71._0_8_;
                  ppdVar55 = ppdVar63;
                  lVar52 = lVar44;
                  if (dVar68 + 1.0 / dVar68 <= dVar68) {
                    do {
                      (*ppdVar55)[uVar38] = (*ppdVar55)[uVar38] / dVar68;
                      lVar49 = lVar52 >> 0x20;
                      ppdVar55 = ppdVar55 + 1;
                      lVar52 = lVar52 + 0x100000000;
                    } while (lVar49 < (long)uVar38);
                    goto LAB_0010c61f;
                  }
                }
                uVar46 = uVar45 & 0xffffffff;
              }
              else {
LAB_0010c61f:
                uVar46 = uVar45 & 0xffffffff;
              }
            }
            else {
              auVar87 = ZEXT1664(auVar70);
              in_ZMM0 = ZEXT864((ulong)dVar68);
            }
            auVar71 = auVar87._0_16_;
            uVar45 = uVar45 - 1;
            lVar44 = lVar44 + -0x100000000;
            ppdVar63 = ppdVar63 + -1;
          } while (0 < iVar47);
        }
      }
      else {
        pdVar15 = a[uVar38];
        auVar169._8_8_ = 0;
        auVar169._0_8_ = pdVar15[uVar53];
        vandpd_avx(auVar169,auVar120);
        pdVar16 = a[uVar53];
        auVar177._8_8_ = 0;
        auVar177._0_8_ = pdVar16[uVar38];
        auVar71 = vandpd_avx512vl(auVar177,auVar120);
        vucomisd_avx512f(auVar71);
        if (-1e-12 <= dVar68) {
          auVar174._0_8_ = -pdVar16[uVar38];
          auVar174._8_8_ = 0x8000000000000000;
          auVar179._8_8_ = 0;
          auVar179._0_8_ = pdVar16[uVar53] - dVar67;
          auVar71 = vandpd_avx(auVar179,auVar120);
          auVar72 = vandpd_avx512vl(auVar160,auVar120);
          auVar72 = vaddsd_avx512f(auVar72,auVar71);
          auVar71 = vunpcklpd_avx(ZEXT816(0) << 0x40,auVar179);
          auVar181._0_8_ = auVar72._0_8_;
          auVar181._8_8_ = auVar181._0_8_;
          auVar72 = vdivpd_avx(auVar71,auVar181);
          auVar71 = vunpcklpd_avx(auVar174,auVar160);
          auVar73 = vdivpd_avx(auVar71,auVar181);
          auVar71 = vshufpd_avx(auVar73,auVar73,3);
          auVar182._0_8_ = auVar71._0_8_ * auVar73._0_8_;
          auVar182._8_8_ = auVar71._8_8_ * auVar73._8_8_;
          auVar71 = vshufpd_avx512vl(auVar72,auVar72,3);
          auVar71 = vfmadd213pd_avx512vl(auVar71,auVar72,auVar182);
          auVar74 = vshufpd_avx512vl(auVar71,auVar71,1);
          auVar71 = vdivsd_avx512f(auVar71,auVar74);
          vmovsd_avx512f(auVar71);
          pdVar16[uVar53] = pdVar16[uVar53];
          auVar71 = vshufpd_avx512vl(auVar73,auVar73,1);
          auVar71 = vmulsd_avx512f(auVar71,auVar72);
          auVar72 = vshufpd_avx(auVar72,auVar72,1);
          auVar72 = vfmsub213sd_avx512f(auVar72,auVar73,auVar71);
          dVar67 = auVar72._0_8_ / auVar74._0_8_;
        }
        else {
          pdVar16[uVar53] = dVar68 / pdVar15[uVar53];
          dVar67 = -(pdVar15[uVar38] - dVar67) / pdVar15[uVar53];
        }
        auVar88 = ZEXT1664(auVar71);
        pdVar16[uVar38] = dVar67;
        *(undefined1 (*) [16])(pdVar15 + uVar53) = auVar84;
        if (1 < (long)uVar38) {
          ppdVar63 = a + uVar46;
          lVar44 = uVar46 << 0x20;
          auVar175._0_8_ = -dVar68;
          auVar175._8_8_ = 0x8000000000000000;
          auVar71 = vandpd_avx(auVar160,auVar152);
          auVar72 = vunpcklpd_avx(auVar160,auVar175);
          uVar45 = uVar53 & 0xffffffff;
          do {
            pdVar15 = a[uVar46];
            uVar56 = (ulong)(int)uVar45;
            auVar70 = vxorpd_avx512vl(auVar88._0_16_,auVar88._0_16_);
            auVar88 = ZEXT1664(auVar70);
            bVar64 = uVar38 < uVar56;
            uVar22 = uVar38 - uVar56;
            bVar66 = uVar22 == 0;
            if ((long)uVar56 <= (long)uVar38) {
              do {
                auVar3._8_8_ = 0;
                auVar3._0_8_ = pdVar15[uVar56];
                auVar70 = vmovddup_avx512vl(auVar3);
                auVar70 = vfmadd231pd_avx512vl
                                    (auVar88._0_16_,auVar70,
                                     *(undefined1 (*) [16])(a[uVar56] + uVar53));
                auVar88 = ZEXT1664(auVar70);
                uVar56 = uVar56 + 1;
                bVar64 = uVar57 < uVar56;
                uVar22 = uVar57 - uVar56;
                bVar66 = uVar22 == 0;
              } while (!bVar66);
            }
            bVar65 = (POPCOUNT(uVar22 & 0xff) & 1U) == 0;
            auVar185._8_8_ = 0;
            auVar185._0_8_ = pdVar15[uVar46];
            auVar73 = vsubsd_avx512f(auVar185,auVar157);
            auVar188._8_8_ = 0;
            auVar188._0_8_ = vi[uVar46];
            auVar70 = vucomisd_avx512f(auVar188);
            auVar86 = ZEXT1664(auVar70);
            auVar74 = in_ZMM0._0_16_;
            auVar75 = auVar88._0_16_;
            iVar47 = (int)uVar46;
            if (bVar64 || bVar66) {
              auVar76 = vucomisd_avx512f(auVar70);
              if ((!bVar66) || (bVar65)) {
                pdVar16 = a[uVar46 + 1];
                auVar189._8_8_ = 0;
                auVar189._0_8_ = v[uVar46];
                auVar77 = vsubsd_avx512f(auVar189,auVar157);
                auVar76 = vmulsd_avx512f(auVar76,auVar76);
                auVar76 = vfmadd231sd_avx512f(auVar76,auVar77,auVar77);
                vfmadd231sd_avx512f(auVar76,auVar175,auVar160);
                auVar76 = vaddsd_avx512f(auVar77,auVar77);
                auVar77 = vmulsd_avx512f(auVar160,auVar76);
                auVar76 = vucomisd_avx512f(auVar70);
                auVar186._8_8_ = 0;
                auVar186._0_8_ = pdVar15[uVar46 + 1];
                auVar187._8_8_ = 0;
                auVar187._0_8_ = pdVar16[uVar46];
                if ((bVar66) &&
                   (((!bVar65 && (auVar77 = vucomisd_avx512f(auVar70), bVar66)) && (!bVar65)))) {
                  auVar76 = vandpd_avx512vl(auVar73,auVar120);
                  auVar76 = vaddsd_avx512f(auVar71,auVar76);
                  auVar78 = vandpd_avx512vl(auVar186,auVar120);
                  auVar76 = vaddsd_avx512f(auVar76,auVar78);
                  auVar78 = vandpd_avx512vl(auVar187,auVar120);
                  auVar76 = vaddsd_avx512f(auVar76,auVar78);
                  auVar78 = vandpd_avx512vl(auVar74,auVar120);
                  auVar76 = vaddsd_avx512f(auVar78,auVar76);
                  auVar78 = vmulsd_avx512f(auVar69,auVar76);
                  auVar76 = auVar78;
                  do {
                    auVar76 = vmulsd_avx512f(auVar76,ZEXT816(0x3f847ae147ae147b));
                    vaddsd_avx512f(auVar78,auVar76);
                    vucomisd_avx512f(auVar78);
                  } while (!bVar64 && !bVar66);
                }
                auVar78 = vshufpd_avx512vl(auVar75,auVar75,1);
                auVar79 = vandpd_avx512vl(auVar76,auVar120);
                auVar80 = vandpd_avx512vl(auVar77,auVar120);
                auVar79 = vaddsd_avx512f(auVar80,auVar79);
                auVar76 = vdivsd_avx512f(auVar76,auVar79);
                auVar77 = vdivsd_avx512f(auVar77,auVar79);
                auVar80 = vmulsd_avx512f(auVar77,auVar77);
                auVar80 = vfmadd231sd_avx512f(auVar80,auVar76,auVar76);
                auVar81 = vmovddup_avx512vl(auVar74);
                auVar82 = vmulpd_avx512vl(auVar75,auVar81);
                auVar83 = vmovddup_avx512vl(auVar186);
                auVar82 = vfmsub231pd_avx512vl(auVar82,auVar83,auVar87._0_16_);
                auVar82 = vfmadd231pd_avx512vl(auVar82,auVar72,auVar78);
                auVar79 = vmovddup_avx512vl(auVar79);
                auVar79 = vdivpd_avx512vl(auVar82,auVar79);
                auVar82 = vxorpd_avx512vl(auVar79,auVar129);
                auVar77 = vmovddup_avx512vl(auVar77);
                auVar82 = vshufpd_avx512vl(auVar79,auVar82,1);
                auVar77 = vmulpd_avx512vl(auVar77,auVar82);
                auVar76 = vmovddup_avx512vl(auVar76);
                auVar76 = vfmadd213pd_avx512vl(auVar76,auVar79,auVar77);
                auVar77 = vmovddup_avx512vl(auVar80);
                auVar76 = vdivpd_avx512vl(auVar76,auVar77);
                *(undefined1 (*) [16])(pdVar15 + uVar53) = auVar76;
                vandpd_avx512vl(auVar83,auVar120);
                auVar77 = vandpd_avx512vl(auVar81,auVar120);
                auVar77 = vaddsd_avx512f(auVar71,auVar77);
                vucomisd_avx512f(auVar77);
                if (bVar64 || bVar66) {
                  auVar73 = vdivsd_avx512f(auVar74,auVar77);
                  auVar74 = vdivsd_avx512f(auVar160,auVar77);
                  auVar75 = vmulsd_avx512f(auVar74,auVar74);
                  auVar75 = vfmadd231sd_avx512f(auVar75,auVar73,auVar73);
                  auVar78 = vmovddup_avx512vl(auVar187);
                  auVar76 = vfnmsub213pd_avx512vl(auVar76,auVar78,auVar87._0_16_);
                  auVar77 = vmovddup_avx512vl(auVar77);
                  auVar76 = vdivpd_avx512vl(auVar76,auVar77);
                  auVar77 = vxorpd_avx512vl(auVar76,auVar129);
                  auVar74 = vmovddup_avx512vl(auVar74);
                  auVar77 = vshufpd_avx512vl(auVar76,auVar77,1);
                  auVar74 = vmulpd_avx512vl(auVar74,auVar77);
                  auVar73 = vmovddup_avx512vl(auVar73);
                  auVar73 = vfmadd213pd_avx512vl(auVar73,auVar76,auVar74);
                  auVar74 = vmovddup_avx512vl(auVar75);
                  auVar73 = vdivpd_avx512vl(auVar73,auVar74);
                  *(undefined1 (*) [16])(pdVar16 + uVar53) = auVar73;
                }
                else {
                  auVar74 = vfnmsub231sd_avx512f(auVar75,auVar73,auVar76);
                  auVar75 = vshufpd_avx512vl(auVar76,auVar76,1);
                  auVar74 = vfmadd213sd_avx512f(auVar75,auVar160,auVar74);
                  auVar74 = vdivsd_avx512f(auVar74,auVar186);
                  vmovsd_avx512f(auVar74);
                  pdVar16[uVar53] = pdVar16[uVar53];
                  auVar4._8_8_ = 0;
                  auVar4._0_8_ = pdVar15[uVar38];
                  auVar73 = vfnmsub231sd_avx512f(auVar78,auVar73,auVar4);
                  auVar5._8_8_ = 0;
                  auVar5._0_8_ = pdVar15[uVar53];
                  auVar73 = vfmadd231sd_avx512f(auVar73,auVar175,auVar5);
                  auVar73 = vdivsd_avx512f(auVar73,auVar186);
                  vmovsd_avx512f(auVar73);
                  pdVar16[uVar38] = pdVar16[uVar38];
                }
              }
              else {
                auVar74 = vxorpd_avx512vl(auVar75,auVar129);
                auVar75 = vandpd_avx512vl(auVar73,auVar152);
                auVar75 = vaddsd_avx512f(auVar71,auVar75);
                auVar73 = vdivsd_avx512f(auVar73,auVar75);
                auVar76 = vdivsd_avx512f(auVar160,auVar75);
                auVar77 = vmulsd_avx512f(auVar76,auVar76);
                auVar77 = vfmadd231sd_avx512f(auVar77,auVar73,auVar73);
                auVar75 = vmovddup_avx512vl(auVar75);
                auVar74 = vdivpd_avx512vl(auVar74,auVar75);
                auVar75 = vxorpd_avx512vl(auVar74,auVar129);
                auVar76 = vmovddup_avx512vl(auVar76);
                auVar75 = vshufpd_avx512vl(auVar74,auVar75,1);
                auVar75 = vmulpd_avx512vl(auVar76,auVar75);
                auVar73 = vmovddup_avx512vl(auVar73);
                auVar73 = vfmadd213pd_avx512vl(auVar73,auVar74,auVar75);
                auVar74 = vmovddup_avx512vl(auVar77);
                auVar73 = vdivpd_avx512vl(auVar73,auVar74);
                *(undefined1 (*) [16])(pdVar15 + uVar53) = auVar73;
              }
              auVar73 = vandpd_avx512vl(auVar152,*(undefined1 (*) [16])(pdVar15 + uVar53));
              auVar74 = vshufps_avx512vl(auVar73,auVar73,0x4e);
              vmaxsd_avx512f(auVar73,auVar74);
              auVar70 = vucomisd_avx512f(auVar70);
              auVar88 = ZEXT1664(auVar70);
              if ((!bVar66) || (bVar65)) {
                if ((long)iVar47 <= (long)uVar38) {
                  auVar73 = vdivsd_avx512f(ZEXT816(0x3ff0000000000000),auVar70);
                  auVar70 = vaddsd_avx512f(auVar70,auVar73);
                  auVar70 = vucomisd_avx512f(auVar70);
                  auVar88 = ZEXT1664(auVar70);
                  if (uVar38 <= (ulong)(long)iVar47) {
                    auVar70 = vmovddup_avx512vl(auVar70);
                    auVar88 = ZEXT1664(auVar70);
                    ppdVar55 = ppdVar63;
                    lVar52 = lVar44;
                    do {
                      auVar73 = vdivpd_avx512vl(*(undefined1 (*) [16])(*ppdVar55 + uVar53),auVar70);
                      *(undefined1 (*) [16])(*ppdVar55 + uVar53) = auVar73;
                      lVar49 = lVar52 >> 0x20;
                      lVar52 = lVar52 + 0x100000000;
                      ppdVar55 = ppdVar55 + 1;
                    } while (lVar49 < (long)uVar38);
                    goto LAB_0010ca5d;
                  }
                }
                uVar45 = uVar46 & 0xffffffff;
              }
              else {
LAB_0010ca5d:
                uVar45 = uVar46 & 0xffffffff;
              }
            }
            else {
              in_ZMM0 = ZEXT1664(auVar73);
              auVar87 = ZEXT1664(auVar75);
            }
            auVar70 = auVar87._0_16_;
            uVar46 = uVar46 - 1;
            lVar44 = lVar44 + -0x100000000;
            ppdVar63 = ppdVar63 + -1;
          } while (0 < iVar47);
        }
        auVar71 = vshufpd_avx(auVar70,auVar70,1);
      }
      auVar70 = vunpcklpd_avx(auVar70,auVar71);
      uVar62 = uVar62 - 1;
      uVar51 = uVar51 - 1;
      uVar57 = uVar57 - 1;
      bVar64 = 0 < (long)uVar38;
      uVar38 = uVar53;
    } while (bVar64);
    uVar38 = 0;
    do {
      if ((long)uVar38 < lVar48 || lVar54 < (long)uVar38) {
        pdVar15 = a[uVar38];
        pdVar16 = u[uVar38];
        uVar57 = uVar38;
        do {
          pdVar16[uVar57] = pdVar15[uVar57];
          uVar57 = uVar57 + 1;
        } while (uVar43 != uVar57);
      }
      uVar38 = uVar38 + 1;
    } while (uVar38 != uVar43);
  }
  if ((int)uVar60 < n) {
    lVar44 = (long)n;
    do {
      lVar52 = (long)(int)uVar34;
      if (lVar54 < (int)uVar34) {
        lVar52 = lVar54;
      }
      if (lVar52 <= lVar48) {
        lVar52 = lVar48;
      }
      lVar44 = lVar44 + -1;
      if ((int)uVar60 <= (int)uVar58) {
        lVar49 = lVar48;
        do {
          auVar86 = ZEXT864(0) << 0x40;
          lVar59 = lVar48;
          do {
            auVar103._8_8_ = 0;
            auVar103._0_8_ = u[lVar49][lVar59];
            auVar6._8_8_ = 0;
            auVar6._0_8_ = a[lVar59][lVar44];
            auVar69 = vfmadd231sd_fma(auVar86._0_16_,auVar103,auVar6);
            auVar86 = ZEXT1664(auVar69);
            lVar59 = lVar59 + 1;
          } while (lVar52 + 1 != lVar59);
          u[lVar49][lVar44] = auVar69._0_8_;
          lVar49 = lVar49 + 1;
        } while (uVar58 + 1 != (int)lVar49);
      }
      uVar34 = uVar34 - 1;
    } while (lVar48 < lVar44);
  }
  uVar43 = 0;
LAB_0010d6ba:
  uVar34 = EigenRG(int,double**,double*,double*,double**,int*,double*)::is2;
  uVar60 = EigenRG(int,double**,double*,double*,double**,int*,double*)::is1;
  if ((int)uVar43 == 0) {
    if (n != 0) {
      lVar48 = (long)(int)EigenRG(int,double**,double*,double*,double**,int*,double*)::is1;
      if ((int)EigenRG(int,double**,double*,double*,double**,int*,double*)::is1 <
          (int)EigenRG(int,double**,double*,double*,double**,int*,double*)::is2) {
        iVar47 = EigenRG(int,double**,double*,double*,double**,int*,double*)::is2 + 1;
        auVar86 = vpbroadcastq_avx512f();
        auVar87 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        do {
          if (0 < n) {
            pdVar15 = u[lVar48];
            auVar14._8_8_ = 0;
            auVar14._0_8_ = work[lVar48];
            auVar88 = vbroadcastsd_avx512f(auVar14);
            uVar43 = 0;
            do {
              auVar90 = vpbroadcastq_avx512f();
              auVar90 = vporq_avx512f(auVar90,auVar87);
              uVar38 = vpcmpuq_avx512f(auVar90,auVar86,2);
              pdVar16 = pdVar15 + uVar43;
              auVar91._8_8_ = (ulong)((byte)(uVar38 >> 1) & 1) * (long)pdVar16[1];
              auVar91._0_8_ = (ulong)((byte)uVar38 & 1) * (long)*pdVar16;
              auVar91._16_8_ = (ulong)((byte)(uVar38 >> 2) & 1) * (long)pdVar16[2];
              auVar91._24_8_ = (ulong)((byte)(uVar38 >> 3) & 1) * (long)pdVar16[3];
              auVar91._32_8_ = (ulong)((byte)(uVar38 >> 4) & 1) * (long)pdVar16[4];
              auVar91._40_8_ = (ulong)((byte)(uVar38 >> 5) & 1) * (long)pdVar16[5];
              auVar91._48_8_ = (ulong)((byte)(uVar38 >> 6) & 1) * (long)pdVar16[6];
              auVar91._56_8_ = (uVar38 >> 7) * (long)pdVar16[7];
              auVar90 = vmulpd_avx512f(auVar88,auVar91);
              pdVar16 = pdVar15 + uVar43;
              bVar64 = (bool)((byte)uVar38 & 1);
              bVar66 = (bool)((byte)(uVar38 >> 1) & 1);
              bVar65 = (bool)((byte)(uVar38 >> 2) & 1);
              bVar18 = (bool)((byte)(uVar38 >> 3) & 1);
              bVar19 = (bool)((byte)(uVar38 >> 4) & 1);
              bVar20 = (bool)((byte)(uVar38 >> 5) & 1);
              bVar21 = (bool)((byte)(uVar38 >> 6) & 1);
              *pdVar16 = (double)((ulong)bVar64 * auVar90._0_8_ | (ulong)!bVar64 * (long)*pdVar16);
              pdVar16[1] = (double)((ulong)bVar66 * auVar90._8_8_ |
                                   (ulong)!bVar66 * (long)pdVar16[1]);
              pdVar16[2] = (double)((ulong)bVar65 * auVar90._16_8_ |
                                   (ulong)!bVar65 * (long)pdVar16[2]);
              pdVar16[3] = (double)((ulong)bVar18 * auVar90._24_8_ |
                                   (ulong)!bVar18 * (long)pdVar16[3]);
              pdVar16[4] = (double)((ulong)bVar19 * auVar90._32_8_ |
                                   (ulong)!bVar19 * (long)pdVar16[4]);
              pdVar16[5] = (double)((ulong)bVar20 * auVar90._40_8_ |
                                   (ulong)!bVar20 * (long)pdVar16[5]);
              pdVar16[6] = (double)((ulong)bVar21 * auVar90._48_8_ |
                                   (ulong)!bVar21 * (long)pdVar16[6]);
              pdVar16[7] = (double)((uVar38 >> 7) * auVar90._56_8_ |
                                   (ulong)!SUB81(uVar38 >> 7,0) * (long)pdVar16[7]);
              uVar43 = uVar43 + 8;
            } while ((n + 7U & 0xfffffff8) != uVar43);
          }
          lVar48 = lVar48 + 1;
        } while (iVar47 != (int)lVar48);
      }
      if (0 < n) {
        iVar47 = 0;
        do {
          if (iVar47 < (int)uVar60 || (int)uVar34 < iVar47) {
            iVar39 = uVar60 - iVar47;
            if (uVar60 - iVar47 == 0 || (int)uVar60 < iVar47) {
              iVar39 = iVar47;
            }
            if (iVar39 != (int)work[iVar39]) {
              pdVar15 = u[iVar39];
              pdVar16 = u[(int)work[iVar39]];
              uVar43 = 0;
              do {
                dVar67 = pdVar15[uVar43];
                pdVar15[uVar43] = pdVar16[uVar43];
                pdVar16[uVar43] = dVar67;
                uVar43 = uVar43 + 1;
              } while ((uint)n != uVar43);
            }
          }
          iVar47 = iVar47 + 1;
        } while (iVar47 != n);
      }
    }
    if (0 < n) {
      uVar43 = 0;
      do {
        if ((vi[uVar43] != 0.0) || (NAN(vi[uVar43]))) {
          return 2;
        }
        uVar43 = uVar43 + 1;
      } while ((uint)n != uVar43);
    }
    iVar47 = 0;
  }
  else {
    puts("\nInternal error in \'EigenRealGeneral\'.");
    printf("rc = %d\n",uVar43);
    iVar47 = 1;
  }
  return iVar47;
LAB_0010d317:
  dVar68 = in_ZMM11._0_8_;
  if (uVar51 == uVar62) {
    pdVar15[lVar59] = dVar67 + local_138;
    v[lVar59] = dVar67 + local_138;
    dVar67 = 0.0;
    local_15c = uVar37;
  }
  else {
    dVar119 = (in_ZMM10._0_8_ - dVar67) * 0.5;
    auVar166._8_8_ = 0;
    auVar166._0_8_ = dVar119;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = local_98;
    auVar84 = vfmadd213sd_fma(auVar166,auVar166,auVar12);
    auVar28._8_8_ = 0x7fffffffffffffff;
    auVar28._0_8_ = 0x7fffffffffffffff;
    auVar70 = vandpd_avx512vl(auVar84,auVar28);
    if (auVar70._0_8_ < 0.0) {
      in_ZMM0._0_8_ = sqrt(auVar70._0_8_);
      in_ZMM0._8_56_ = extraout_var_00;
      in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
      in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
      auVar87 = ZEXT864(0) << 0x40;
      auVar86 = ZEXT1664(auVar69);
      local_d8._0_16_ = auVar84;
    }
    else {
      auVar70 = vsqrtsd_avx(auVar70,auVar70);
      in_ZMM0 = ZEXT1664(auVar70);
    }
    in_ZMM12 = ZEXT864((ulong)dVar119);
    dVar67 = dVar67 + local_138;
    pdVar15 = a[lVar59];
    pdVar15[lVar59] = dVar67;
    a[lVar49][lVar49] = in_ZMM10._0_8_ + local_138;
    dVar68 = auVar84._0_8_;
    dVar159 = in_ZMM0._0_8_;
    if (-1e-12 <= dVar68) {
      auVar136._0_8_ = -dVar159;
      auVar136._8_8_ = in_ZMM0._8_8_ ^ 0x8000000000000000;
      uVar24 = vcmpsd_avx512f(auVar136,in_ZMM0._0_16_,2);
      bVar64 = (bool)((byte)uVar24 & 1);
      uVar43 = (ulong)bVar64 * (long)dVar159 + (ulong)!bVar64 * (long)auVar136._0_8_;
      auVar167._8_8_ = 0;
      auVar167._0_8_ = dVar119;
      uVar24 = vcmpsd_avx512f(auVar87._0_16_,auVar167,2);
      bVar64 = (bool)((byte)uVar24 & 1);
      dVar119 = dVar119 + (double)(bVar64 * uVar43 + (ulong)!bVar64 * (uVar43 ^ 0x8000000000000000))
      ;
      v[lVar49] = dVar67 + dVar119;
      auVar99._8_8_ = 0;
      auVar99._0_8_ = dVar119;
      uVar24 = vcmpsd_avx512f(auVar99,auVar87._0_16_,4);
      bVar64 = (bool)((byte)uVar24 & 1);
      v[lVar59] = (double)((ulong)bVar64 * (long)(dVar67 - local_98 / dVar119) +
                          (ulong)!bVar64 * (long)(dVar67 + dVar119));
      vi[lVar49] = 0.0;
      vi[lVar59] = 0.0;
      dVar67 = pdVar15[lVar49];
      auVar116._8_8_ = 0;
      auVar116._0_8_ = dVar67;
      auVar84 = vandpd_avx(auVar81,auVar116);
      auVar70 = vandpd_avx(auVar81,auVar99);
      dVar68 = auVar70._0_8_ + auVar84._0_8_;
      auVar117._0_8_ = dVar67 / dVar68;
      auVar117._8_8_ = 0;
      dVar119 = dVar119 / dVar68;
      auVar100._8_8_ = 0;
      auVar100._0_8_ = dVar119 * dVar119;
      auVar84 = vfmadd231sd_fma(auVar100,auVar117,auVar117);
      if (auVar84._0_8_ < 0.0) {
        auVar86._0_8_ = sqrt(auVar84._0_8_);
        auVar86._8_56_ = extraout_var_01;
        auVar84 = auVar86._0_16_;
        in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
        auVar87 = ZEXT864(0) << 0x40;
        auVar86 = ZEXT1664(auVar69);
      }
      else {
        auVar84 = vsqrtsd_avx(auVar84,auVar84);
      }
      in_ZMM7 = ZEXT864((ulong)dVar68);
      auVar168._0_8_ = auVar117._0_8_ / auVar84._0_8_;
      auVar168._8_8_ = 0;
      in_ZMM12 = ZEXT1664(auVar168);
      auVar118._0_8_ = dVar119 / auVar84._0_8_;
      auVar118._8_8_ = 0;
      if ((int)uVar62 <= n) {
        auVar30._8_8_ = 0x8000000000000000;
        auVar30._0_8_ = 0x8000000000000000;
        auVar70 = vxorpd_avx512vl(auVar168,auVar30);
        pdVar15 = a[lVar59];
        pdVar16 = a[lVar49];
        lVar52 = 0;
        do {
          dVar67 = pdVar16[lVar49 + lVar52];
          auVar137._8_8_ = 0;
          auVar137._0_8_ = dVar67;
          auVar146._8_8_ = 0;
          auVar146._0_8_ = auVar168._0_8_ * pdVar15[lVar49 + lVar52];
          auVar71 = vfmadd231sd_fma(auVar146,auVar118,auVar137);
          pdVar16[lVar49 + lVar52] = auVar71._0_8_;
          auVar13._8_8_ = 0;
          auVar13._0_8_ = pdVar15[lVar49 + lVar52];
          auVar138._8_8_ = 0;
          auVar138._0_8_ = dVar67 * auVar70._0_8_;
          auVar71 = vfmadd231sd_fma(auVar138,auVar118,auVar13);
          pdVar15[lVar49 + lVar52] = auVar71._0_8_;
          lVar52 = lVar52 + 1;
        } while ((n + 1) - uVar62 != (int)lVar52);
      }
      if (-1 < (int)uVar62) {
        auVar31._8_8_ = 0x8000000000000000;
        auVar31._0_8_ = 0x8000000000000000;
        auVar70 = vxorpd_avx512vl(auVar168,auVar31);
        uVar43 = 0;
        do {
          pdVar15 = a[uVar43];
          dVar67 = pdVar15[lVar49];
          auVar139._8_8_ = 0;
          auVar139._0_8_ = dVar67;
          auVar147._8_8_ = 0;
          auVar147._0_8_ = pdVar15[lVar59];
          auVar151._8_8_ = 0;
          auVar151._0_8_ = auVar168._0_8_ * pdVar15[lVar59];
          auVar71 = vfmadd231sd_fma(auVar151,auVar118,auVar139);
          pdVar15[lVar49] = auVar71._0_8_;
          auVar140._8_8_ = 0;
          auVar140._0_8_ = dVar67 * auVar70._0_8_;
          auVar71 = vfmadd231sd_fma(auVar140,auVar118,auVar147);
          pdVar15[lVar59] = auVar71._0_8_;
          uVar43 = uVar43 + 1;
        } while (uVar62 + 1 != uVar43);
      }
      auVar32._8_8_ = 0x8000000000000000;
      auVar32._0_8_ = 0x8000000000000000;
      auVar70 = vxorpd_avx512vl(auVar168,auVar32);
      auVar158 = vunpcklpd_avx(auVar118,auVar84);
      lVar52 = 0;
      do {
        pdVar15 = u[lVar48 + lVar52];
        dVar67 = pdVar15[lVar49];
        auVar101._8_8_ = 0;
        auVar101._0_8_ = dVar67;
        in_ZMM0 = ZEXT1664(auVar101);
        auVar141._8_8_ = 0;
        auVar141._0_8_ = pdVar15[lVar59];
        auVar148._8_8_ = 0;
        auVar148._0_8_ = auVar168._0_8_ * pdVar15[lVar59];
        auVar84 = vfmadd231sd_fma(auVar148,auVar118,auVar101);
        pdVar15[lVar49] = auVar84._0_8_;
        auVar149._8_8_ = 0;
        auVar149._0_8_ = dVar67 * auVar70._0_8_;
        auVar84 = vfmadd231sd_fma(auVar149,auVar118,auVar141);
        pdVar15[lVar59] = auVar84._0_8_;
        lVar52 = lVar52 + 1;
      } while (iVar47 != (int)lVar52);
      goto LAB_0010d696;
    }
    v[lVar49] = dVar119 + dVar67;
    v[lVar59] = dVar119 + dVar67;
    vi[lVar49] = dVar159;
    auVar29._8_8_ = 0x8000000000000000;
    auVar29._0_8_ = 0x8000000000000000;
    auVar84 = vxorpd_avx512vl(in_ZMM0._0_16_,auVar29);
    dVar67 = auVar84._0_8_;
  }
  auVar158._8_8_ = in_ZMM11._8_8_;
  vi[lVar59] = dVar67;
  auVar158._0_8_ = dVar68;
LAB_0010d696:
  auVar84 = in_ZMM7._0_16_;
  in_ZMM11 = ZEXT1664(auVar158);
  uVar62 = local_15c;
  if ((int)local_15c < (int)uVar60) goto code_r0x0010d6a5;
  goto LAB_0010cbd9;
code_r0x0010d6a5:
  auVar70 = vshufpd_avx(auVar158,auVar158,1);
  goto LAB_0010c36e;
}

Assistant:

int EigenRealGeneral (int n, double **a, double *v, double *vi, double **u, int *iwork, double *work)
	/*      n = order of a                                                      */
	/*    **a = input matrix in row-ptr representation; will be destroyed       */
	/*     *v = array of size 'n' to receive eigenvalues                        */
	/*    *vi = work vector of size 'n' for imaginary components of eigenvalues */
	/*    **u = matrix in row-ptr representation to receive eigenvectors        */
	/* *iwork = work vector of size 'n'                                         */
	/*  *work = work vector of size 'n'                                         */
{
	int			i, rc;

	rc = EigenRG (n, a, v, vi, u, iwork, work);
	if (rc != NO_ERROR)
		{
		puts("\nInternal error in 'EigenRealGeneral'.");
		printf ("rc = %d\n", rc);
		return ERROR;
		}

	for (i = 0; i < n; i++)
		{
		if (vi[i] != 0.0)
			return RC_COMPLEX_EVAL;
		}

	return NO_ERROR;
}